

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TransformPromiseNodeBase *this_00;
  PromiseNode *in_RCX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *pAVar3;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX;
  AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_> *extraout_RDX_00;
  PromiseNode *pPVar4;
  Own<kj::_::ChainPromiseNode> OVar5;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar6;
  Promise<unsigned_long> PVar7;
  Fault f;
  Own<kj::_::PromiseNode> local_70;
  Promise<unsigned_long> local_60;
  Own<kj::_::PromiseNode> local_50;
  Fault local_40;
  undefined8 uStack_38;
  
  if (output[7]._vptr_AsyncOutputStream == (_func_int **)0x0) {
    pPVar4 = (PromiseNode *)
             ((long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream);
    if (in_RCX < pPVar4) {
      pPVar4 = in_RCX;
    }
    (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
              (&local_70,output[4]._vptr_AsyncOutputStream,amount2,pPVar4);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_70,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:531:17),_kj::_::PropagateException>
               ::anon_class_32_4_39723cd8_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0064ef08;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    this_00[1].dependency.disposer = (Disposer *)amount2;
    this_00[1].dependency.ptr = in_RCX;
    this_00[1].continuationTracePtr = pPVar4;
    local_50.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_50.ptr = (PromiseNode *)this_00;
    OVar5 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_40,&local_50);
    pPVar4 = local_50.ptr;
    local_60.super_PromiseBase.node.disposer._0_4_ = local_40.exception._0_4_;
    local_60.super_PromiseBase.node.disposer._4_4_ = local_40.exception._4_4_;
    local_60.super_PromiseBase.node.ptr = uStack_38;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      (**(local_50.disposer)->_vptr_Disposer)
                (local_50.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode,OVar5.ptr);
    }
    OVar6 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                      ((kj *)&local_40,(Canceler *)(output + 7),&local_60);
    pPVar4 = local_60.super_PromiseBase.node.ptr;
    pAVar3 = OVar6.ptr;
    uVar1 = (undefined4)uStack_38;
    uVar2 = uStack_38._4_4_;
    uStack_38 = (PromiseNode *)0x0;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_40.exception._0_4_;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_40.exception._4_4_;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         uVar1;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uVar2;
    if (local_60.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_60.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_60.super_PromiseBase.node.disposer._4_4_,
                           local_60.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_60.super_PromiseBase.node.disposer._4_4_,
                          local_60.super_PromiseBase.node.disposer._0_4_),
                 pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
      pAVar3 = extraout_RDX;
    }
    pPVar4 = local_70.ptr;
    if (local_70.ptr != (PromiseNode *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      (**(local_70.disposer)->_vptr_Disposer)
                (local_70.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode)
      ;
      pAVar3 = extraout_RDX_00;
    }
    PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pAVar3;
    PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<unsigned_long>)PVar7.super_PromiseBase.node;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x20f,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }